

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall pbrt::syntactic::Scene::Scene(Scene *this)

{
  this->_vptr_Scene = (_func_int **)&PTR__Scene_0016a210;
  (this->cameras).
  super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cameras).
  super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cameras).
  super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sampler).super___shared_ptr<pbrt::syntactic::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sampler).super___shared_ptr<pbrt::syntactic::Sampler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->integrator).super___shared_ptr<pbrt::syntactic::Integrator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->integrator).super___shared_ptr<pbrt::syntactic::Integrator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->volumeIntegrator).
  super___shared_ptr<pbrt::syntactic::VolumeIntegrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->volumeIntegrator).
  super___shared_ptr<pbrt::syntactic::VolumeIntegrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->surfaceIntegrator).
  super___shared_ptr<pbrt::syntactic::SurfaceIntegrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->surfaceIntegrator).
  super___shared_ptr<pbrt::syntactic::SurfaceIntegrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pixelFilter).super___shared_ptr<pbrt::syntactic::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->pixelFilter).super___shared_ptr<pbrt::syntactic::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<pbrt::syntactic::Object,char_const(&)[7]>((char (*) [7])&this->world);
  (this->basePath)._M_dataplus._M_p = (pointer)&(this->basePath).field_2;
  (this->basePath)._M_string_length = 0;
  (this->basePath).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Scene()
        : world(std::make_shared<Object>("<root>"))
      {}